

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.h
# Opt level: O2

void __thiscall
chrono::utils::CSV_writer::write_to_file(CSV_writer *this,string *filename,string *header)

{
  string asStack_238 [32];
  ofstream ofile;
  
  std::ofstream::ofstream((ostream *)&ofile,(filename->_M_dataplus)._M_p,_S_out);
  std::operator<<((ostream *)&ofile,(string *)header);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&ofile,asStack_238);
  std::__cxx11::string::~string(asStack_238);
  std::ofstream::close();
  std::ofstream::~ofstream(&ofile);
  return;
}

Assistant:

void write_to_file(const std::string& filename, const std::string& header = "") const {
        std::ofstream ofile(filename.c_str());
        ofile << header;
        ofile << m_ss.str();
        ofile.close();
    }